

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

PathTypeSetterSlotIndex * __thiscall
Js::PathTypeHandlerBase::UpdateSetterSlots
          (PathTypeHandlerBase *this,Recycler *recycler,PathTypeSetterSlotIndex *oldSetters,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  ushort uVar1;
  Recycler *this_00;
  uchar *puVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  ulong count;
  uint uVar4;
  byte bVar5;
  undefined3 in_register_00000081;
  uint8 i;
  ulong uVar6;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = SUB84(CONCAT71(in_register_00000009,oldPathSize),0);
  count = (ulong)CONCAT31(in_register_00000081,newTypePathSize);
  local_60 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9af3a56;
  data.filename._0_4_ = 0x900;
  data.plusSize = count;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  uVar6 = 0;
  puVar2 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  if (oldSetters != (PathTypeSetterSlotIndex *)0x0) {
    uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
    uVar4 = data._36_4_ & 0xff;
    if (newTypePathSize < (byte)data._36_1_) {
      uVar4 = (uint)newTypePathSize;
    }
    uVar6 = (ulong)uVar4;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      bVar5 = oldSetters[uVar3];
      if (uVar1 >> 1 <= (ushort)bVar5) {
        bVar5 = 0xff;
      }
      puVar2[uVar3] = bVar5;
    }
  }
  for (; uVar6 < count; uVar6 = uVar6 + 1) {
    puVar2[uVar6] = 0xff;
  }
  return puVar2;
}

Assistant:

PathTypeSetterSlotIndex * PathTypeHandlerBase::UpdateSetterSlots(Recycler * recycler, PathTypeSetterSlotIndex * oldSetters, uint8 oldPathSize, uint8 newTypePathSize)
    {
        PathTypeSetterSlotIndex * newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
        uint8 initStart;
        if (oldSetters == nullptr)
        {
            initStart = 0;
        }
        else
        {
            uint16 pathLength = GetPathLength();
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            for (uint8 i = 0; i < initStart; i++)
            {
                // Only copy setter indices that refer to the part of the path contained by this handler already.
                // Otherwise, wait for the correct index, which may be different on this path of the branch,
                // to be set when the setter property is added to the handler.
                PathTypeSetterSlotIndex oldIndex = oldSetters[i];
                newSetters[i] = oldIndex < pathLength ? oldIndex : NoSetterSlot;
            }
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newSetters[i] = NoSetterSlot;
        }

        return newSetters;
    }